

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQueue.cpp
# Opt level: O0

int test1(void)

{
  pointer *this;
  pointer *this_00;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_00;
  bool bVar1;
  bool local_2fa;
  int local_2c4;
  bool areEqual;
  int local_2b4;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_2b0;
  reference_wrapper<Consumer> local_2a8;
  thread local_2a0;
  thread consumer4Thr;
  duration<long,_std::ratio<1L,_1000L>_> local_290;
  int local_284;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_280;
  reference_wrapper<Consumer> local_278;
  thread local_270;
  thread consumer3Thr;
  duration<long,_std::ratio<1L,_1000L>_> local_260;
  int local_254;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_250;
  reference_wrapper<Consumer> local_248;
  thread local_240;
  thread consumer2Thr;
  duration<long,_std::ratio<1L,_1000L>_> local_230;
  int local_224;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_220;
  reference_wrapper<Consumer> local_218;
  thread local_210;
  thread consumer1Thr;
  duration<long,_std::ratio<1L,_1000L>_> local_200;
  int local_1f4;
  duration<long,_std::ratio<1L,_1000L>_> local_1f0;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_1e8;
  reference_wrapper<Producer> local_1e0;
  thread local_1d8;
  thread prodThr;
  Consumer cons4;
  Consumer cons3;
  Consumer cons2;
  Consumer cons1;
  Producer prod;
  Queue<int> q;
  duration<long,_std::ratio<1L,_1000L>_> local_80;
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  unsubscribeTime;
  allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> local_3d;
  int local_3c;
  duration<long,std::ratio<1l,1000l>> local_38 [8];
  duration<long,std::ratio<1l,1000l>> *local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  subscribeTime;
  
  std::operator<<((ostream *)&std::cout,"\n ---------------- First Test ---------------- \n");
  std::operator<<((ostream *)&std::cout,"OUTPUT:  all the consumers read 100 messages\n\n");
  local_3c = 5;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_38,&local_3c);
  local_28 = 1;
  local_30 = local_38;
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::allocator(&local_3d);
  __l_00._M_len = local_28;
  __l_00._M_array = (iterator)local_30;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
            *)local_20,__l_00,&local_3d);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~allocator(&local_3d);
  q._204_4_ = 0x5dc;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_80,(int *)&q.field_0xcc);
  local_78 = &local_80;
  local_70 = 1;
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)&q.field_0xcb);
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
            *)local_68,__l,(allocator_type *)&q.field_0xcb);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)&q.field_0xcb);
  this = &prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  rtb::Concurrency::Queue<int>::Queue((Queue<int> *)this);
  this_00 = &cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  Producer::Producer((Producer *)this_00);
  Consumer::Consumer((Consumer *)
                     &cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  Consumer::Consumer((Consumer *)
                     &cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  Consumer::Consumer((Consumer *)
                     &cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  Consumer::Consumer((Consumer *)&prodThr);
  local_1e0 = std::ref<Producer>((Producer *)this_00);
  local_1e8 = std::ref<rtb::Concurrency::Queue<int>>((Queue<int> *)this);
  local_1f4 = 10;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_1f0,&local_1f4);
  consumer1Thr._M_id._M_thread._4_4_ = 10;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_200,
             (int *)((long)&consumer1Thr._M_id._M_thread + 4));
  consumer1Thr._M_id._M_thread._0_4_ = 100;
  std::thread::
  thread<std::reference_wrapper<Producer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>,int,void>
            (&local_1d8,&local_1e0,&local_1e8,&local_1f0,&local_200,(int *)&consumer1Thr);
  local_218 = std::ref<Consumer>((Consumer *)
                                 &cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_220 = std::ref<rtb::Concurrency::Queue<int>>
                        ((Queue<int> *)
                         &prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  local_224 = 1;
  consumer2Thr._M_id._M_thread._4_4_ = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_230,
             (int *)((long)&consumer2Thr._M_id._M_thread + 4));
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_210,&local_218,&local_220,&local_224,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_20,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_68,&local_230);
  local_248 = std::ref<Consumer>((Consumer *)
                                 &cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_250 = std::ref<rtb::Concurrency::Queue<int>>
                        ((Queue<int> *)
                         &prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  local_254 = 2;
  consumer3Thr._M_id._M_thread._4_4_ = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_260,
             (int *)((long)&consumer3Thr._M_id._M_thread + 4));
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_240,&local_248,&local_250,&local_254,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_20,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_68,&local_260);
  local_278 = std::ref<Consumer>((Consumer *)
                                 &cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_280 = std::ref<rtb::Concurrency::Queue<int>>
                        ((Queue<int> *)
                         &prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  local_284 = 3;
  consumer4Thr._M_id._M_thread._4_4_ = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_290,
             (int *)((long)&consumer4Thr._M_id._M_thread + 4));
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_270,&local_278,&local_280,&local_284,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_20,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_68,&local_290);
  local_2a8 = std::ref<Consumer>((Consumer *)&prodThr);
  local_2b0 = std::ref<rtb::Concurrency::Queue<int>>
                        ((Queue<int> *)
                         &prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  local_2b4 = 4;
  local_2c4 = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&stack0xfffffffffffffd40,&local_2c4);
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_2a0,&local_2a8,&local_2b0,&local_2b4,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_20,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_68,(duration<long,_std::ratio<1L,_1000L>_> *)&stack0xfffffffffffffd40);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  bVar1 = std::operator==((vector<int,_std::allocator<int>_> *)
                          &cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<int,_std::allocator<int>_> *)
                          &cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_2fa = false;
  if (bVar1) {
    bVar1 = std::operator==((vector<int,_std::allocator<int>_> *)
                            &cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<int,_std::allocator<int>_> *)
                            &cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_2fa = false;
    if (bVar1) {
      bVar1 = std::operator==((vector<int,_std::allocator<int>_> *)
                              &cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<int,_std::allocator<int>_> *)
                              &cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_2fa = false;
      if (bVar1) {
        local_2fa = std::operator==((vector<int,_std::allocator<int>_> *)
                                    &cons1.consumedValues.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage,
                                    (vector<int,_std::allocator<int>_> *)&prodThr);
      }
    }
  }
  std::thread::~thread(&local_2a0);
  std::thread::~thread(&local_270);
  std::thread::~thread(&local_240);
  std::thread::~thread(&local_210);
  std::thread::~thread(&local_1d8);
  Consumer::~Consumer((Consumer *)&prodThr);
  Consumer::~Consumer((Consumer *)
                      &cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Consumer::~Consumer((Consumer *)
                      &cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Consumer::~Consumer((Consumer *)
                      &cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Producer::~Producer((Producer *)
                      &cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  rtb::Concurrency::Queue<int>::~Queue
            ((Queue<int> *)
             &prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
             *)local_68);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
             *)local_20);
  return (uint)local_2fa;
}

Assistant:

int test1() {
    // FIRST TEST
    // Producer start first (at 10) and send 100 msg with a period of 10
    // 4 Consumers subscribe before (at 5) and unsubscribe (at 1500)
    // OUTPUT: all the consumers should read everything

    std::cout << "\n ---------------- First Test ---------------- \n";
    std::cout << "OUTPUT:  all the consumers read 100 messages\n\n";

    std::vector<TimeT> subscribeTime = { TimeT{ 5 } };
    std::vector<TimeT> unsubscribeTime = { TimeT{ 1500 } };

    Queue<int> q;

    Producer prod;
    Consumer cons1, cons2, cons3, cons4;

    // producer thread
    std::thread prodThr(ref(prod), ref(q), TimeT{ 10 }, TimeT{ 10 }, 100);

    // consumer threads
    std::thread consumer1Thr(ref(cons1), ref(q), 1, subscribeTime, unsubscribeTime, TimeT{ 0 });
    std::thread consumer2Thr(ref(cons2), ref(q), 2, subscribeTime, unsubscribeTime, TimeT{ 0 });
    std::thread consumer3Thr(ref(cons3), ref(q), 3, subscribeTime, unsubscribeTime, TimeT{ 0 });
    std::thread consumer4Thr(ref(cons4), ref(q), 4, subscribeTime, unsubscribeTime, TimeT{ 0 });

    prodThr.join();
    consumer1Thr.join();
    consumer2Thr.join();
    consumer3Thr.join();
    consumer4Thr.join();

    bool areEqual = (prod.producedValues == cons1.consumedValues)
                    && (prod.producedValues == cons2.consumedValues)
                    && (prod.producedValues == cons3.consumedValues)
                    && (prod.producedValues == cons4.consumedValues);

    return areEqual;
}